

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O0

void __thiscall BRTS<RemSP>::PerformLabeling(BRTS<RemSP> *this)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  Mat1b *pMVar5;
  uint uVar6;
  uint *puVar7;
  uint local_b4;
  int j;
  int label;
  unsigned_short end_pos;
  unsigned_short start_pos;
  uint *labels;
  int i;
  int local_8c;
  Size local_88;
  Mat_<int> local_80;
  Run *local_20;
  Run *runs;
  int h;
  int w;
  BRTS<RemSP> *this_local;
  
  runs._4_4_ = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  runs._0_4_ = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  _h = this;
  Data_Compressed::Alloc(&this->data_compressed,(int)runs,runs._4_4_);
  InitCompressedData(this,&this->data_compressed);
  Runs::Alloc(&this->data_runs,(int)runs,runs._4_4_);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar5->field_0x8;
  iVar4 = *(int *)&pMVar5->field_0xc;
  RemSP::Alloc(((iVar3 + 1) - (iVar3 + 1 >> 0x1f) >> 1) * ((iVar4 + 1) - (iVar4 + 1 >> 0x1f) >> 1) +
               1);
  RemSP::Setup();
  FindRuns(this,(this->data_compressed).bits,(int)runs,(this->data_compressed).data_width,
           (this->data_runs).runs);
  local_20 = (this->data_runs).runs;
  cv::MatSize::operator()((MatSize *)&local_88);
  local_8c = 0;
  cv::Mat_<int>::Mat_(&local_80,&local_88,&local_8c);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_80)
  ;
  cv::Mat_<int>::~Mat_(&local_80);
  for (labels._0_4_ = 0; (int)labels < (int)runs; labels._0_4_ = (int)labels + 1) {
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)labels);
    for (; uVar1 = local_20->start_pos, uVar1 != 0xffff; local_20 = local_20 + 1) {
      uVar2 = local_20->end_pos;
      uVar6 = RemSP::GetLabel(local_20->label);
      for (local_b4 = (uint)uVar1; (int)local_b4 < (int)(uint)uVar2; local_b4 = local_b4 + 1) {
        puVar7[(int)local_b4] = uVar6;
      }
    }
    local_20 = local_20 + 1;
  }
  RemSP::Dealloc();
  Runs::Dealloc(&this->data_runs);
  Data_Compressed::Dealloc(&this->data_compressed);
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        img_labels_ = cv::Mat1i(img_.size(), 0); // (0-init)
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }